

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<double>::emplace<double&>
          (QPodArrayOps<double> *this,qsizetype i,double *args)

{
  qsizetype *pqVar1;
  double dVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  double *pdVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<double>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<double>).size == i) &&
       (qVar5 = QArrayDataPointer<double>::freeSpaceAtEnd(&this->super_QArrayDataPointer<double>),
       qVar5 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<double>).size;
      (this->super_QArrayDataPointer<double>).ptr[lVar4] = *args;
      (this->super_QArrayDataPointer<double>).size = lVar4 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<double>::freeSpaceAtBegin(&this->super_QArrayDataPointer<double>),
       qVar5 != 0)) {
      pdVar6 = (this->super_QArrayDataPointer<double>).ptr;
      pdVar6[-1] = *args;
      (this->super_QArrayDataPointer<double>).ptr = pdVar6 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<double>).size;
      *pqVar1 = *pqVar1 + 1;
      return;
    }
  }
  dVar2 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<double>).size != 0);
  QArrayDataPointer<double>::detachAndGrow
            (&this->super_QArrayDataPointer<double>,where,1,(double **)0x0,
             (QArrayDataPointer<double> *)0x0);
  pdVar6 = createHole(this,where,i,1);
  *pdVar6 = dVar2;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }